

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaValidateStreamInternal(xmlSchemaValidCtxtPtr ctxt,xmlParserCtxtPtr pctxt)

{
  xmlSchemaSAXPlugPtr plug_00;
  int local_24;
  int ret;
  xmlSchemaSAXPlugPtr plug;
  xmlParserCtxtPtr pctxt_local;
  xmlSchemaValidCtxtPtr ctxt_local;
  
  pctxt->linenumbers = 1;
  xmlSchemaValidateSetLocator(ctxt,xmlSchemaValidateStreamLocator,pctxt);
  ctxt->parserCtxt = pctxt;
  ctxt->input = pctxt->input->buf;
  plug_00 = xmlSchemaSAXPlug(ctxt,&pctxt->sax,&pctxt->userData);
  if (plug_00 == (xmlSchemaSAXPlugPtr)0x0) {
    local_24 = -1;
  }
  else {
    ctxt->input = pctxt->input->buf;
    ctxt->sax = pctxt->sax;
    ctxt->flags = ctxt->flags | 1;
    local_24 = xmlSchemaVStart(ctxt);
    if (((local_24 == 0) && (ctxt->parserCtxt->wellFormed == 0)) &&
       (local_24 = ctxt->parserCtxt->errNo, local_24 == 0)) {
      local_24 = 1;
    }
  }
  ctxt->parserCtxt = (xmlParserCtxtPtr)0x0;
  ctxt->sax = (xmlSAXHandlerPtr)0x0;
  ctxt->input = (xmlParserInputBufferPtr)0x0;
  if (plug_00 != (xmlSchemaSAXPlugPtr)0x0) {
    xmlSchemaSAXUnplug(plug_00);
  }
  return local_24;
}

Assistant:

static int
xmlSchemaValidateStreamInternal(xmlSchemaValidCtxtPtr ctxt,
                                 xmlParserCtxtPtr pctxt) {
    xmlSchemaSAXPlugPtr plug = NULL;
    int ret;

    pctxt->linenumbers = 1;
    xmlSchemaValidateSetLocator(ctxt, xmlSchemaValidateStreamLocator, pctxt);

    ctxt->parserCtxt = pctxt;
    ctxt->input = pctxt->input->buf;

    /*
     * Plug the validation and launch the parsing
     */
    plug = xmlSchemaSAXPlug(ctxt, &(pctxt->sax), &(pctxt->userData));
    if (plug == NULL) {
        ret = -1;
	goto done;
    }
    ctxt->input = pctxt->input->buf;
    ctxt->sax = pctxt->sax;
    ctxt->flags |= XML_SCHEMA_VALID_CTXT_FLAG_STREAM;
    ret = xmlSchemaVStart(ctxt);

    if ((ret == 0) && (! ctxt->parserCtxt->wellFormed)) {
	ret = ctxt->parserCtxt->errNo;
	if (ret == 0)
	    ret = 1;
    }

done:
    ctxt->parserCtxt = NULL;
    ctxt->sax = NULL;
    ctxt->input = NULL;
    if (plug != NULL) {
        xmlSchemaSAXUnplug(plug);
    }
    return (ret);
}